

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

WeierstrassCurve * ecc_weierstrass_curve(mp_int *p,mp_int *a,mp_int *b,mp_int *nonsquare_mod_p)

{
  WeierstrassCurve *pWVar1;
  mp_int *pmVar2;
  MontyContext *mc;
  ModsqrtContext *pMVar3;
  
  pMVar3 = (ModsqrtContext *)0x0;
  pWVar1 = (WeierstrassCurve *)safemalloc(1,0x28,0);
  pmVar2 = mp_copy(p);
  pWVar1->p = pmVar2;
  mc = monty_new(p);
  pWVar1->mc = mc;
  pmVar2 = monty_import(mc,a);
  pWVar1->a = pmVar2;
  pmVar2 = monty_import(pWVar1->mc,b);
  pWVar1->b = pmVar2;
  if (nonsquare_mod_p != (mp_int *)0x0) {
    pMVar3 = modsqrt_new(p,nonsquare_mod_p);
  }
  pWVar1->sc = pMVar3;
  return pWVar1;
}

Assistant:

WeierstrassCurve *ecc_weierstrass_curve(
    mp_int *p, mp_int *a, mp_int *b, mp_int *nonsquare_mod_p)
{
    WeierstrassCurve *wc = snew(WeierstrassCurve);
    wc->p = mp_copy(p);
    wc->mc = monty_new(p);
    wc->a = monty_import(wc->mc, a);
    wc->b = monty_import(wc->mc, b);

    if (nonsquare_mod_p)
        wc->sc = modsqrt_new(p, nonsquare_mod_p);
    else
        wc->sc = NULL;

    return wc;
}